

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_field *tfield,bool init,
          bool pointer,bool constant,bool reference)

{
  int iVar1;
  t_type *ttype;
  undefined3 in_register_00000089;
  t_base_type *this_00;
  undefined1 auVar2 [12];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_90);
  if (CONCAT31(in_register_00000089,constant) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  type_name_abi_cxx11_(&local_90,this,tfield->type_,false,false);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  if (tfield->reference_ == true) {
    std::operator+(&local_70,"::std::shared_ptr<",__return_storage_ptr__);
    std::operator+(&local_90,&local_70,">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pointer) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (reference) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_90," ",&tfield->name_);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  if (init) {
    ttype = t_type::get_true_type(tfield->type_);
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar1 != '\0') {
        type_name_abi_cxx11_(&local_50,this,ttype,false,false);
        std::operator+(&local_70," = static_cast<",&local_50);
        std::operator+(&local_90,&local_70,">(0)");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      switch(this_00) {
      case (t_base_type *)0x0:
      case (t_base_type *)0x1:
        goto switchD_00172806_caseD_0;
      case (t_base_type *)0x2:
        break;
      case (t_base_type *)0x3:
      case (t_base_type *)0x4:
      case (t_base_type *)0x5:
      case (t_base_type *)0x6:
        break;
      case (t_base_type *)0x7:
        break;
      default:
        auVar2 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_90,this_00,auVar2._8_4_);
        std::operator+(auVar2._0_8_,"compiler error: no C++ initializer for base type ",&local_90);
        __cxa_throw(auVar2._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
switchD_00172806_caseD_0:
  if (!reference) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::declare_field(t_field* tfield,
                                      bool init,
                                      bool pointer,
                                      bool constant,
                                      bool reference) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "";
  if (constant) {
    result += "const ";
  }
  result += type_name(tfield->get_type());
  if (is_reference(tfield)) {
    result = "::std::shared_ptr<" + result + ">";
  }
  if (pointer) {
    result += "*";
  }
  if (reference) {
    result += "&";
  }
  result += " " + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
      case t_base_type::TYPE_STRING:
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no C++ initializer for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = static_cast<" + type_name(type) + ">(0)";
    }
  }
  if (!reference) {
    result += ";";
  }
  return result;
}